

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O1

int knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,char *hostp,int port,char *key,size_t keylen,
                   int typemask,libssh2_knownhost **ext)

{
  short sVar1;
  uint uVar2;
  undefined4 uVar3;
  list_node *plVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  list_node *plVar10;
  size_t datalen;
  list_node *plVar11;
  char *__s;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char *keyalloc;
  uchar hash [20];
  EVP_MAC_CTX *ctx;
  char hostbuff [270];
  int local_1a8;
  list_node *local_1a0;
  char *local_190;
  LIBSSH2_KNOWNHOSTS *local_188;
  list_head *local_180;
  char *local_178;
  char *local_170;
  char local_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  undefined4 local_158;
  EVP_MAC_CTX *local_150;
  char local_148 [280];
  
  uVar14 = typemask & 0xffff;
  local_190 = (char *)0x0;
  if (uVar14 == 2) {
    return 1;
  }
  __s = hostp;
  if (-1 < port) {
    uVar7 = snprintf(local_148,0x10e,"[%s]:%d",hostp);
    __s = local_148;
    if (0x10d < uVar7) {
      _libssh2_error(hosts->session,-0x26,"Known-host write buffer too small");
      return 3;
    }
  }
  if ((((uint)typemask >> 0x11 & 1) == 0) &&
     (sVar9 = _libssh2_base64_encode(hosts->session,key,keylen,&local_190), key = local_190,
     sVar9 == 0)) {
    _libssh2_error(hosts->session,-6,"Unable to allocate memory for base64-encoded key");
    return 3;
  }
  uVar12 = (uint)port >> 0x1f;
  local_180 = &hosts->head;
  uVar7 = typemask & 0x3c0000;
  local_1a8 = 2;
  local_1a0 = (list_node *)0x0;
  local_188 = hosts;
  local_178 = hostp;
  local_170 = key;
  do {
    plVar10 = (list_node *)_libssh2_list_first(local_180);
    bVar13 = false;
    if (plVar10 == (list_node *)0x0) {
      bVar13 = false;
    }
    else {
      do {
        sVar1 = *(short *)((long)&plVar10[1].head + 4);
        bVar5 = bVar13;
        if (sVar1 == 3) {
          if (uVar14 == 3) {
LAB_0011b2d7:
            iVar8 = strcmp(__s,(char *)plVar10[1].next);
            bVar5 = iVar8 == 0;
          }
        }
        else if (sVar1 == 2) {
          if ((((uVar14 == 1) && (iVar8 = _libssh2_hmac_ctx_init(&local_150), iVar8 != 0)) &&
              (plVar10[1].prev == (list_node *)0x14)) &&
             (iVar8 = _libssh2_hmac_sha1_init(&local_150,plVar10[2].next,(size_t)plVar10[2].prev),
             iVar8 != 0)) {
            datalen = strlen(__s);
            iVar8 = _libssh2_hmac_update(&local_150,__s,datalen);
            if ((iVar8 == 0) || (iVar8 = _libssh2_hmac_final(&local_150,&local_168), iVar8 == 0)) {
              _libssh2_hmac_cleanup(&local_150);
            }
            else {
              _libssh2_hmac_cleanup(&local_150);
              plVar4 = plVar10[1].next;
              uVar3 = *(undefined4 *)&plVar4->head;
              auVar16[0] = -((char)uVar3 == (char)local_158);
              auVar16[1] = -((char)((uint)uVar3 >> 8) == (char)((uint)local_158 >> 8));
              auVar16[2] = -((char)((uint)uVar3 >> 0x10) == (char)((uint)local_158 >> 0x10));
              auVar16[3] = -((char)((uint)uVar3 >> 0x18) == (char)((uint)local_158 >> 0x18));
              auVar16[4] = 0xff;
              auVar16[5] = 0xff;
              auVar16[6] = 0xff;
              auVar16[7] = 0xff;
              auVar16[8] = 0xff;
              auVar16[9] = 0xff;
              auVar16[10] = 0xff;
              auVar16[0xb] = 0xff;
              auVar16[0xc] = 0xff;
              auVar16[0xd] = 0xff;
              auVar16[0xe] = 0xff;
              auVar16[0xf] = 0xff;
              auVar15[0] = -(*(char *)&plVar4->next == local_168);
              auVar15[1] = -(*(char *)((long)&plVar4->next + 1) == cStack_167);
              auVar15[2] = -(*(char *)((long)&plVar4->next + 2) == cStack_166);
              auVar15[3] = -(*(char *)((long)&plVar4->next + 3) == cStack_165);
              auVar15[4] = -(*(char *)((long)&plVar4->next + 4) == cStack_164);
              auVar15[5] = -(*(char *)((long)&plVar4->next + 5) == cStack_163);
              auVar15[6] = -(*(char *)((long)&plVar4->next + 6) == cStack_162);
              auVar15[7] = -(*(char *)((long)&plVar4->next + 7) == cStack_161);
              auVar15[8] = -(*(char *)&plVar4->prev == cStack_160);
              auVar15[9] = -(*(char *)((long)&plVar4->prev + 1) == cStack_15f);
              auVar15[10] = -(*(char *)((long)&plVar4->prev + 2) == cStack_15e);
              auVar15[0xb] = -(*(char *)((long)&plVar4->prev + 3) == cStack_15d);
              auVar15[0xc] = -(*(char *)((long)&plVar4->prev + 4) == cStack_15c);
              auVar15[0xd] = -(*(char *)((long)&plVar4->prev + 5) == cStack_15b);
              auVar15[0xe] = -(*(char *)((long)&plVar4->prev + 6) == cStack_15a);
              auVar15[0xf] = -(*(char *)((long)&plVar4->prev + 7) == cStack_159);
              auVar15 = auVar15 & auVar16;
              bVar5 = true;
              if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) {
                bVar5 = bVar13;
              }
            }
          }
        }
        else if ((sVar1 == 1) && (uVar14 == 1)) goto LAB_0011b2d7;
        bVar13 = false;
        if (bVar5) {
          uVar2 = *(uint *)((long)&plVar10[1].head + 4);
          bVar5 = true;
          bVar13 = false;
          if ((uVar7 == 0) || ((uVar7 != 0x3c0000 && (uVar7 == (uVar2 & 0x3c0000))))) {
            plVar4 = (list_node *)plVar10[2].head;
            iVar8 = strcmp(local_170,(char *)plVar4);
            if (iVar8 == 0) {
              bVar13 = true;
              if (ext != (libssh2_knownhost **)0x0) {
                *(undefined4 *)&plVar10[4].prev = 0xdeadcafe;
                plVar10[4].head = (list_head *)plVar10;
                if ((short)uVar2 == 1) {
                  plVar11 = plVar10[1].next;
                }
                else {
                  plVar11 = (list_node *)0x0;
                }
                plVar10[5].next = plVar11;
                plVar10[5].prev = plVar4;
                *(uint *)&plVar10[5].head = uVar2;
                *ext = (libssh2_knownhost *)&plVar10[4].prev;
              }
              local_1a8 = 0;
              bVar5 = false;
              local_1a0 = (list_node *)0x0;
            }
            else if (local_1a0 == (list_node *)0x0) {
              local_1a0 = plVar10;
            }
          }
          if (!bVar5) break;
        }
        plVar10 = (list_node *)_libssh2_list_next(plVar10);
      } while (plVar10 != (list_node *)0x0);
    }
    cVar6 = (char)uVar12;
    uVar12 = 1;
    __s = local_178;
    if (cVar6 != '\0' || bVar13) {
      if ((local_1a0 != (list_node *)0x0) && (local_1a8 = 1, ext != (libssh2_knownhost **)0x0)) {
        *(undefined4 *)&local_1a0[4].prev = 0xdeadcafe;
        local_1a0[4].head = (list_head *)local_1a0;
        uVar3 = *(undefined4 *)((long)&local_1a0[1].head + 4);
        if ((short)uVar3 == 1) {
          plVar10 = local_1a0[1].next;
        }
        else {
          plVar10 = (list_node *)0x0;
        }
        local_1a0[5].next = plVar10;
        local_1a0[5].prev = (list_node *)local_1a0[2].head;
        *(undefined4 *)&local_1a0[5].head = uVar3;
        *ext = (libssh2_knownhost *)&local_1a0[4].prev;
      }
      if (local_190 != (char *)0x0) {
        (*local_188->session->free)(local_190,&local_188->session->abstract);
        return local_1a8;
      }
      return local_1a8;
    }
  } while( true );
}

Assistant:

static int
knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,
                const char *hostp, int port,
                const char *key, size_t keylen,
                int typemask,
                struct libssh2_knownhost **ext)
{
    struct known_host *node;
    struct known_host *badkey = NULL;
    int type = typemask & LIBSSH2_KNOWNHOST_TYPE_MASK;
    char *keyalloc = NULL;
    int rc = LIBSSH2_KNOWNHOST_CHECK_NOTFOUND;
    char hostbuff[270]; /* most host names can't be longer than like 256 */
    const char *host;
    int numcheck; /* number of host combos to check */
    int match = 0;

    if(type == LIBSSH2_KNOWNHOST_TYPE_SHA1)
        /* we can't work with a sha1 as given input */
        return LIBSSH2_KNOWNHOST_CHECK_MISMATCH;

    /* if a port number is given, check for a '[host]:port' first before the
       plain 'host' */
    if(port >= 0) {
        int len = snprintf(hostbuff, sizeof(hostbuff), "[%s]:%d", hostp, port);
        if(len < 0 || len >= (int)sizeof(hostbuff)) {
            _libssh2_error(hosts->session,
                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                           "Known-host write buffer too small");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }
        host = hostbuff;
        numcheck = 2; /* check both combos, start with this */
    }
    else {
        host = hostp;
        numcheck = 1; /* only check this host version */
    }

    if(!(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64)) {
        /* we got a raw key input, convert it to base64 for the checks below */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &keyalloc);
        if(!nlen) {
            _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for base64-encoded "
                           "key");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }

        /* make the key point to this */
        key = keyalloc;
    }

    do {
        node = _libssh2_list_first(&hosts->head);
        while(node) {
            switch(node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) {
            case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
                if(type == LIBSSH2_KNOWNHOST_TYPE_CUSTOM)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_SHA1:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN) {
                    /* when we have the sha1 version stored, we can use a
                       plain input to produce a hash to compare with the
                       stored hash.
                    */
                    unsigned char hash[SHA_DIGEST_LENGTH];
                    libssh2_hmac_ctx ctx;
                    if(!_libssh2_hmac_ctx_init(&ctx))
                        break;

                    if(SHA_DIGEST_LENGTH != node->name_len) {
                        /* the name hash length must be the sha1 size or
                           we can't match it */
                        break;
                    }
                    if(!_libssh2_hmac_sha1_init(&ctx,
                                                node->salt, node->salt_len))
                        break;
                    if(!_libssh2_hmac_update(&ctx, host, strlen(host)) ||
                       !_libssh2_hmac_final(&ctx, hash)) {
                        _libssh2_hmac_cleanup(&ctx);
                        break;
                    }
                    _libssh2_hmac_cleanup(&ctx);

                    if(!memcmp(hash, node->name, SHA_DIGEST_LENGTH))
                        /* this is a node we're interested in */
                        match = 1;
                }
                break;
            default: /* unsupported type */
                break;
            }
            if(match) {
                int host_key_type = typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                int known_key_type =
                    node->typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                /* match on key type as follows:
                   - never match on an unknown key type
                   - if key_type is set to zero, ignore it an match always
                   - otherwise match when both key types are equal
                */
                if(host_key_type != LIBSSH2_KNOWNHOST_KEY_UNKNOWN &&
                     (host_key_type == 0 ||
                      host_key_type == known_key_type)) {
                    /* host name and key type match, now compare the keys */
                    if(!strcmp(key, node->key)) {
                        /* they match! */
                        if(ext)
                            *ext = knownhost_to_external(node);
                        badkey = NULL;
                        rc = LIBSSH2_KNOWNHOST_CHECK_MATCH;
                        break;
                    }
                    else {
                        /* remember the first node that had a host match but a
                           failed key match since we continue our search from
                           here */
                        if(!badkey)
                            badkey = node;
                    }
                }
                match = 0; /* don't count this as a match anymore */
            }
            node = _libssh2_list_next(&node->node);
        }
        host = hostp;
    } while(!match && --numcheck);

    if(badkey) {
        /* key mismatch */
        if(ext)
            *ext = knownhost_to_external(badkey);
        rc = LIBSSH2_KNOWNHOST_CHECK_MISMATCH;
    }

    if(keyalloc)
        LIBSSH2_FREE(hosts->session, keyalloc);

    return rc;
}